

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs_no_zeroinit.h
# Opt level: O1

void __thiscall
BMRS_XZ<RemSP>::InitCompressedDataMem
          (BMRS_XZ<RemSP> *this,Data_Compressed *data_compressed,MemMat<unsigned_char> *img)

{
  int *piVar1;
  uint uVar2;
  Mat1b *pMVar3;
  uint64_t *puVar4;
  long lVar5;
  long *plVar6;
  long lVar7;
  long *plVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong *puVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  lVar9 = (long)*(int *)&pMVar3->field_0x8;
  if (0 < lVar9) {
    uVar2 = *(uint *)&pMVar3->field_0xc;
    puVar4 = data_compressed->bits;
    lVar5 = *(long *)&(img->accesses_).field_0x10;
    plVar6 = *(long **)&(img->accesses_).field_0x48;
    lVar7 = *(long *)&(img->img_).field_0x10;
    plVar8 = *(long **)&(img->img_).field_0x48;
    uVar10 = uVar2 + 0x3f;
    if (-1 < (int)uVar2) {
      uVar10 = uVar2;
    }
    lVar17 = 0;
    do {
      puVar13 = puVar4 + data_compressed->data_width * lVar17;
      lVar11 = lVar5 + 0x80;
      uVar16 = (ulong)(uint)((int)uVar2 >> 6);
      lVar18 = lVar7 + 0x1f;
      if (0 < (int)uVar2 >> 6) {
        do {
          lVar15 = *plVar6 * lVar17;
          piVar1 = (int *)(lVar11 + -0x80 + lVar15);
          *piVar1 = *piVar1 + 1;
          lVar19 = *plVar8 * lVar17;
          uVar14 = (ulong)(*(char *)(lVar18 + -0x1f + lVar19) != '\0');
          piVar1 = (int *)(lVar11 + -0x7c + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 + 2;
          if (*(char *)(lVar18 + -0x1e + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + -0x78 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 + 4;
          if (*(char *)(lVar18 + -0x1d + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + -0x74 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 + 8;
          if (*(char *)(lVar18 + -0x1c + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + -0x70 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 | 0x10;
          if (*(char *)(lVar18 + -0x1b + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + -0x6c + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x20;
          if (*(char *)(lVar18 + -0x1a + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + -0x68 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 | 0x40;
          if (*(char *)(lVar18 + -0x19 + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + -100 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x80;
          if (*(char *)(lVar18 + -0x18 + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + -0x60 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 | 0x100;
          if (*(char *)(lVar18 + -0x17 + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + -0x5c + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x200;
          if (*(char *)(lVar18 + -0x16 + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + -0x58 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 | 0x400;
          if (*(char *)(lVar18 + -0x15 + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + -0x54 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x800;
          if (*(char *)(lVar18 + -0x14 + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + -0x50 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 | 0x1000;
          if (*(char *)(lVar18 + -0x13 + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + -0x4c + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x2000;
          if (*(char *)(lVar18 + -0x12 + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + -0x48 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 | 0x4000;
          if (*(char *)(lVar18 + -0x11 + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + -0x44 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x8000;
          if (*(char *)(lVar18 + -0x10 + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + -0x40 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 | 0x10000;
          if (*(char *)(lVar18 + -0xf + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + -0x3c + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x20000;
          if (*(char *)(lVar18 + -0xe + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + -0x38 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 | 0x40000;
          if (*(char *)(lVar18 + -0xd + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + -0x34 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x80000;
          if (*(char *)(lVar18 + -0xc + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + -0x30 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 | 0x100000;
          if (*(char *)(lVar18 + -0xb + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + -0x2c + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x200000;
          if (*(char *)(lVar18 + -10 + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + -0x28 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 | 0x400000;
          if (*(char *)(lVar18 + -9 + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + -0x24 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x800000;
          if (*(char *)(lVar18 + -8 + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + -0x20 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 | 0x1000000;
          if (*(char *)(lVar18 + -7 + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + -0x1c + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x2000000;
          if (*(char *)(lVar18 + -6 + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + -0x18 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 | 0x4000000;
          if (*(char *)(lVar18 + -5 + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + -0x14 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x8000000;
          if (*(char *)(lVar18 + -4 + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + -0x10 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 | 0x10000000;
          if (*(char *)(lVar18 + -3 + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + -0xc + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x20000000;
          if (*(char *)(lVar18 + -2 + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + -8 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 | 0x40000000;
          if (*(char *)(lVar18 + -1 + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + -4 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x80000000;
          if (*(char *)(lVar18 + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          *(int *)(lVar11 + lVar15) = *(int *)(lVar11 + lVar15) + 1;
          uVar14 = uVar12 | 0x100000000;
          if (*(char *)(lVar18 + 1 + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + 4 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x200000000;
          if (*(char *)(lVar18 + 2 + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + 8 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 | 0x400000000;
          if (*(char *)(lVar18 + 3 + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + 0xc + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x800000000;
          if (*(char *)(lVar18 + 4 + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + 0x10 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 | 0x1000000000;
          if (*(char *)(lVar18 + 5 + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + 0x14 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x2000000000;
          if (*(char *)(lVar18 + 6 + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + 0x18 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 | 0x4000000000;
          if (*(char *)(lVar18 + 7 + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + 0x1c + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x8000000000;
          if (*(char *)(lVar18 + 8 + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + 0x20 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 | 0x10000000000;
          if (*(char *)(lVar18 + 9 + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + 0x24 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x20000000000;
          if (*(char *)(lVar18 + 10 + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + 0x28 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 | 0x40000000000;
          if (*(char *)(lVar18 + 0xb + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + 0x2c + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x80000000000;
          if (*(char *)(lVar18 + 0xc + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + 0x30 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 | 0x100000000000;
          if (*(char *)(lVar18 + 0xd + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + 0x34 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x200000000000;
          if (*(char *)(lVar18 + 0xe + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + 0x38 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 | 0x400000000000;
          if (*(char *)(lVar18 + 0xf + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + 0x3c + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x800000000000;
          if (*(char *)(lVar18 + 0x10 + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + 0x40 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 | 0x1000000000000;
          if (*(char *)(lVar18 + 0x11 + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + 0x44 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x2000000000000;
          if (*(char *)(lVar18 + 0x12 + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + 0x48 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 | 0x4000000000000;
          if (*(char *)(lVar18 + 0x13 + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + 0x4c + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x8000000000000;
          if (*(char *)(lVar18 + 0x14 + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + 0x50 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 | 0x10000000000000;
          if (*(char *)(lVar18 + 0x15 + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + 0x54 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x20000000000000;
          if (*(char *)(lVar18 + 0x16 + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + 0x58 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 | 0x40000000000000;
          if (*(char *)(lVar18 + 0x17 + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + 0x5c + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x80000000000000;
          if (*(char *)(lVar18 + 0x18 + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + 0x60 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 | 0x100000000000000;
          if (*(char *)(lVar18 + 0x19 + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + 100 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x200000000000000;
          if (*(char *)(lVar18 + 0x1a + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + 0x68 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 | 0x400000000000000;
          if (*(char *)(lVar18 + 0x1b + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + 0x6c + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x800000000000000;
          if (*(char *)(lVar18 + 0x1c + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + 0x70 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 | 0x1000000000000000;
          if (*(char *)(lVar18 + 0x1d + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + 0x74 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x2000000000000000;
          if (*(char *)(lVar18 + 0x1e + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          piVar1 = (int *)(lVar11 + 0x78 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar14 = uVar12 | 0x4000000000000000;
          if (*(char *)(lVar18 + 0x1f + lVar19) == '\0') {
            uVar14 = uVar12;
          }
          piVar1 = (int *)(lVar11 + 0x7c + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar14 | 0x8000000000000000;
          if (*(char *)(lVar18 + 0x20 + lVar19) == '\0') {
            uVar12 = uVar14;
          }
          *puVar13 = uVar12;
          puVar13 = puVar13 + 1;
          lVar18 = lVar18 + 0x40;
          lVar11 = lVar11 + 0x100;
          uVar16 = uVar16 - 1;
        } while (uVar16 != 0);
      }
      if ((int)uVar2 % 0x40 < 1) {
        uVar16 = 0;
      }
      else {
        lVar11 = *plVar6;
        lVar18 = *plVar8;
        uVar12 = 0;
        uVar16 = 0;
        do {
          piVar1 = (int *)(lVar11 * lVar17 + lVar5 + (long)(int)(uVar10 & 0xffffffc0) * 4 +
                          uVar12 * 4);
          *piVar1 = *piVar1 + 1;
          uVar14 = 0;
          if (*(char *)(lVar18 * lVar17 + lVar7 + (int)(uVar10 & 0xffffffc0) + uVar12) != '\0') {
            uVar14 = 1L << ((byte)uVar12 & 0x3f);
          }
          uVar16 = uVar16 | uVar14;
          uVar12 = uVar12 + 1;
        } while ((uint)((int)uVar2 % 0x40) != uVar12);
      }
      *puVar13 = uVar16;
      lVar17 = lVar17 + 1;
    } while (lVar17 != lVar9);
  }
  return;
}

Assistant:

void InitCompressedDataMem(Data_Compressed& data_compressed, MemMat<unsigned char>& img) {
        int w(img_.cols);
        int h(img_.rows);

        for (int i = 0; i < h; i++) {
            uint64_t* mbits = data_compressed[i];
            uchar* source = img_.ptr<uchar>(i);
            for (int j = 0; j < w >> 6; j++) {
                int j_base = (j << 6);
                uint64_t obits = 0;
                if (img(i, j_base + 0)) obits |= 0x0000000000000001;
                if (img(i, j_base + 1)) obits |= 0x0000000000000002;
                if (img(i, j_base + 2)) obits |= 0x0000000000000004;
                if (img(i, j_base + 3)) obits |= 0x0000000000000008;
                if (img(i, j_base + 4)) obits |= 0x0000000000000010;
                if (img(i, j_base + 5)) obits |= 0x0000000000000020;
                if (img(i, j_base + 6)) obits |= 0x0000000000000040;
                if (img(i, j_base + 7)) obits |= 0x0000000000000080;
                if (img(i, j_base + 8)) obits |= 0x0000000000000100;
                if (img(i, j_base + 9)) obits |= 0x0000000000000200;
                if (img(i, j_base + 10)) obits |= 0x0000000000000400;
                if (img(i, j_base + 11)) obits |= 0x0000000000000800;
                if (img(i, j_base + 12)) obits |= 0x0000000000001000;
                if (img(i, j_base + 13)) obits |= 0x0000000000002000;
                if (img(i, j_base + 14)) obits |= 0x0000000000004000;
                if (img(i, j_base + 15)) obits |= 0x0000000000008000;
                if (img(i, j_base + 16)) obits |= 0x0000000000010000;
                if (img(i, j_base + 17)) obits |= 0x0000000000020000;
                if (img(i, j_base + 18)) obits |= 0x0000000000040000;
                if (img(i, j_base + 19)) obits |= 0x0000000000080000;
                if (img(i, j_base + 20)) obits |= 0x0000000000100000;
                if (img(i, j_base + 21)) obits |= 0x0000000000200000;
                if (img(i, j_base + 22)) obits |= 0x0000000000400000;
                if (img(i, j_base + 23)) obits |= 0x0000000000800000;
                if (img(i, j_base + 24)) obits |= 0x0000000001000000;
                if (img(i, j_base + 25)) obits |= 0x0000000002000000;
                if (img(i, j_base + 26)) obits |= 0x0000000004000000;
                if (img(i, j_base + 27)) obits |= 0x0000000008000000;
                if (img(i, j_base + 28)) obits |= 0x0000000010000000;
                if (img(i, j_base + 29)) obits |= 0x0000000020000000;
                if (img(i, j_base + 30)) obits |= 0x0000000040000000;
                if (img(i, j_base + 31)) obits |= 0x0000000080000000;
                if (img(i, j_base + 32)) obits |= 0x0000000100000000;
                if (img(i, j_base + 33)) obits |= 0x0000000200000000;
                if (img(i, j_base + 34)) obits |= 0x0000000400000000;
                if (img(i, j_base + 35)) obits |= 0x0000000800000000;
                if (img(i, j_base + 36)) obits |= 0x0000001000000000;
                if (img(i, j_base + 37)) obits |= 0x0000002000000000;
                if (img(i, j_base + 38)) obits |= 0x0000004000000000;
                if (img(i, j_base + 39)) obits |= 0x0000008000000000;
                if (img(i, j_base + 40)) obits |= 0x0000010000000000;
                if (img(i, j_base + 41)) obits |= 0x0000020000000000;
                if (img(i, j_base + 42)) obits |= 0x0000040000000000;
                if (img(i, j_base + 43)) obits |= 0x0000080000000000;
                if (img(i, j_base + 44)) obits |= 0x0000100000000000;
                if (img(i, j_base + 45)) obits |= 0x0000200000000000;
                if (img(i, j_base + 46)) obits |= 0x0000400000000000;
                if (img(i, j_base + 47)) obits |= 0x0000800000000000;
                if (img(i, j_base + 48)) obits |= 0x0001000000000000;
                if (img(i, j_base + 49)) obits |= 0x0002000000000000;
                if (img(i, j_base + 50)) obits |= 0x0004000000000000;
                if (img(i, j_base + 51)) obits |= 0x0008000000000000;
                if (img(i, j_base + 52)) obits |= 0x0010000000000000;
                if (img(i, j_base + 53)) obits |= 0x0020000000000000;
                if (img(i, j_base + 54)) obits |= 0x0040000000000000;
                if (img(i, j_base + 55)) obits |= 0x0080000000000000;
                if (img(i, j_base + 56)) obits |= 0x0100000000000000;
                if (img(i, j_base + 57)) obits |= 0x0200000000000000;
                if (img(i, j_base + 58)) obits |= 0x0400000000000000;
                if (img(i, j_base + 59)) obits |= 0x0800000000000000;
                if (img(i, j_base + 60)) obits |= 0x1000000000000000;
                if (img(i, j_base + 61)) obits |= 0x2000000000000000;
                if (img(i, j_base + 62)) obits |= 0x4000000000000000;
                if (img(i, j_base + 63)) obits |= 0x8000000000000000;
                *mbits = obits, mbits++;
            }
            uint64_t obits_final = 0;
            int jbase = w - (w % 64);
            for (int j = 0; j < w % 64; j++) {
                if (img(i, jbase + j)) obits_final |= ((uint64_t)1 << j);
            }
            *mbits = obits_final;
        }
    }